

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::api::anon_unknown_1::GraphicsPipeline::create
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *param_3)

{
  deUint64 *pdVar1;
  Handle<(vk::HandleType)18> object;
  VkAllocationCallbacks *pVVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  undefined8 *puVar5;
  Checked<vk::Handle<(vk::HandleType)18>_> CVar6;
  VkResult *in_R9;
  VkResult result;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  scopedHandles;
  vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_> handles;
  undefined1 local_64 [28];
  undefined8 *local_48;
  undefined8 *puStack_40;
  undefined8 *local_38;
  
  local_38 = (undefined8 *)0x0;
  local_48 = (undefined8 *)0x0;
  puStack_40 = (undefined8 *)0x0;
  puVar5 = (undefined8 *)operator_new(8);
  puStack_40 = puVar5 + 1;
  *puVar5 = 0;
  local_64._0_4_ = VK_NOT_READY;
  local_48 = puVar5;
  local_38 = puStack_40;
  createMultiple((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
                  *)(local_64 + 4),env,res,(Parameters *)&local_48,
                 (vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                  *)local_64,in_R9);
  ::vk::checkResult(local_64._0_4_,"result",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
                    ,0x6c5);
  pdVar1 = *(deUint64 **)local_64._4_8_;
  object.m_internal = *pdVar1;
  pdVar1[2] = 0;
  pdVar1[3] = 0;
  *pdVar1 = 0;
  pdVar1[1] = 0;
  CVar6 = ::vk::refdetails::check<vk::Handle<(vk::HandleType)18>>(object);
  pDVar3 = env->vkd;
  pVVar4 = env->device;
  pVVar2 = env->allocationCallbacks;
  (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal
       = (deUint64)CVar6.object.m_internal;
  (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.
  m_deviceIface = pDVar3;
  (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device =
       pVVar4;
  (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.
  m_allocator = pVVar2;
  std::
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *)(local_64 + 4));
  operator_delete(puVar5,8);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkPipeline> create (const Environment& env, const Resources& res, const Parameters&)
	{
		vector<VkPipeline>		handles			(1, DE_NULL);
		VkResult				result			= VK_NOT_READY;
		vector<VkPipelineSp>	scopedHandles	= createMultiple(env, res, Parameters(), &handles, &result);

		VK_CHECK(result);
		return Move<VkPipeline>(check<VkPipeline>(scopedHandles.front()->disown()), Deleter<VkPipeline>(env.vkd, env.device, env.allocationCallbacks));
	}